

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

void __thiscall aim_t::AimTraverse(aim_t *this)

{
  double *pdVar1;
  double dVar2;
  uint uVar3;
  sector_t_conflict *psVar4;
  extsector_t *peVar5;
  F3DFloor **ppFVar6;
  undefined8 *puVar7;
  AActor *ac;
  player_t *ppVar8;
  AWeapon *pAVar9;
  double dVar10;
  AimTarget *res;
  int frontflag;
  intercept_t *in;
  PClass *pPVar11;
  DAngle *pDVar12;
  long lVar13;
  AimTarget *res_00;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  double dVar20;
  int planestocheck;
  double dStack_190;
  secplane_t **local_188;
  AimTarget *local_180;
  AimTarget *local_178;
  AimTarget *local_170;
  DAngle local_168;
  DAngle local_160;
  DAngle local_158;
  DAngle local_150;
  DAngle local_148;
  DAngle local_140;
  DAngle local_138;
  DAngle local_130;
  FPathTraverse it;
  DAngle local_e8;
  DAngle local_e0;
  DAngle local_d8;
  DAngle local_d0;
  FLineOpening open;
  
  (this->linetarget).super_FTranslatedLineTarget.attackAngleFromSource.Degrees = 0.0;
  *(undefined8 *)&(this->linetarget).super_FTranslatedLineTarget.unlinked = 0;
  (this->linetarget).super_FTranslatedLineTarget.linetarget = (AActor *)0x0;
  (this->linetarget).super_FTranslatedLineTarget.angleFromSource.Degrees = 0.0;
  (this->linetarget).pitch.Degrees = 0.0;
  (this->linetarget).frac = 3.4028234663852886e+38;
  (this->thing_friend).pitch.Degrees = 0.0;
  (this->thing_friend).super_FTranslatedLineTarget.linetarget = (AActor *)0x0;
  (this->thing_friend).super_FTranslatedLineTarget.angleFromSource.Degrees = 0.0;
  (this->thing_friend).super_FTranslatedLineTarget.attackAngleFromSource.Degrees = 0.0;
  *(undefined8 *)&(this->thing_friend).super_FTranslatedLineTarget.unlinked = 0;
  (this->thing_friend).frac = 3.4028234663852886e+38;
  (this->thing_other).super_FTranslatedLineTarget.linetarget = (AActor *)0x0;
  (this->thing_other).super_FTranslatedLineTarget.angleFromSource.Degrees = 0.0;
  (this->thing_other).super_FTranslatedLineTarget.attackAngleFromSource.Degrees = 0.0;
  *(undefined8 *)&(this->thing_other).super_FTranslatedLineTarget.unlinked = 0;
  (this->thing_other).pitch.Degrees = 0.0;
  (this->thing_other).frac = 3.4028234663852886e+38;
  psVar4 = this->lastsector;
  peVar5 = psVar4->e;
  uVar14 = (ulong)(peVar5->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
  this->crossedffloors = uVar14 != 0;
  this->lastfloorplane = (secplane_t *)0x0;
  this->lastceilingplane = (secplane_t *)0x0;
  bVar15 = false;
  if (((this->aimdir & 1U) != 0) &&
     ((this->toppitch).Degrees <= 0.0 && (this->toppitch).Degrees != 0.0)) {
    bVar15 = (psVar4->planes[1].Flags & 0x1d0U) == 0x100;
  }
  bVar16 = false;
  if (((this->aimdir & 2U) != 0) && (0.0 < (this->bottompitch).Degrees)) {
    bVar16 = (psVar4->planes[0].Flags & 0x1d0U) == 0x100;
  }
  local_170 = &this->linetarget;
  local_178 = &this->thing_friend;
  local_180 = &this->thing_other;
  local_188 = &this->lastfloorplane;
  ppFVar6 = (peVar5->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
  for (lVar13 = 0; uVar14 << 3 != lVar13; lVar13 = lVar13 + 8) {
    puVar7 = *(undefined8 **)((long)ppFVar6 + lVar13);
    if ((*(uint *)(puVar7 + 0xb) & 0x4000001) == 1) {
      open.top = (this->startpos).X;
      open.bottom = (this->startpos).Y;
      dVar19 = secplane_t::ZatPoint((secplane_t *)*puVar7,(DVector2 *)&open);
      if ((this->startpos).Z + this->shootthing->Height <= dVar19) {
        this->lastceilingplane = (secplane_t *)*puVar7;
        bVar15 = false;
      }
      open.top = (this->startpos).X;
      open.bottom = (this->startpos).Y;
      dVar19 = secplane_t::ZatPoint((secplane_t *)puVar7[5],(DVector2 *)&open);
      if (dVar19 <= (this->startpos).Z) {
        *local_188 = (secplane_t *)puVar7[5];
        bVar16 = false;
      }
    }
  }
  if (bVar15) {
    local_d0.Degrees = (this->toppitch).Degrees;
    uVar17 = 0;
    uVar18 = 0;
    dVar19 = (this->bottompitch).Degrees;
    if (dVar19 <= 0.0) {
      uVar17 = SUB84(dVar19,0);
      uVar18 = (undefined4)((ulong)dVar19 >> 0x20);
    }
    local_d8.Degrees = (double)CONCAT44(uVar18,uVar17);
    EnterSectorPortal(this,1,0.0,this->lastsector,&local_d0,&local_d8);
  }
  res = local_170;
  if (bVar16) {
    uVar17 = 0;
    uVar18 = 0;
    dVar19 = (this->toppitch).Degrees;
    if (0.0 <= dVar19) {
      uVar17 = SUB84(dVar19,0);
      uVar18 = (undefined4)((ulong)dVar19 >> 0x20);
    }
    local_e0.Degrees = (double)CONCAT44(uVar18,uVar17);
    local_e8.Degrees = (this->bottompitch).Degrees;
    EnterSectorPortal(this,0,0.0,this->lastsector,&local_e0,&local_e8);
  }
  FPathTraverse::FPathTraverse
            (&it,(this->startpos).X,(this->startpos).Y,(this->aimtrace).X,(this->aimtrace).Y,0xf,
             this->startfrac);
  if (aimdebug.Value == true) {
    Printf("Start AimTraverse, start = %f,%f,%f, vect = %f,%f\n",
           SUB84((this->startpos).X * 1.52587890625e-05,0),(this->startpos).Y * 1.52587890625e-05,
           (this->startpos).Z * 1.52587890625e-05,(this->aimtrace).X * 1.52587890625e-05,
           (this->aimtrace).Y * 1.52587890625e-05);
  }
LAB_0041ef83:
  do {
    while( true ) {
      in = FPathTraverse::Next(&it);
      if ((in == (intercept_t *)0x0) ||
         (((res->super_FTranslatedLineTarget).linetarget != (AActor *)0x0 &&
          (pdVar1 = &(this->linetarget).frac, *pdVar1 <= in->frac && in->frac != *pdVar1))))
      goto LAB_0041f6f5;
      ac = (in->d).thing;
      if (in->isaline != true) break;
      open.top = (this->startpos).X;
      open.bottom = (this->startpos).Y;
      frontflag = P_PointOnLineSidePrecise((DVector2 *)&open,(line_t_conflict *)ac);
      if (aimdebug.Value == true) {
        Printf("Found line %d: ___toppitch = %f, ___bottompitch = %f\n",
               SUB84((this->toppitch).Degrees,0),(this->bottompitch).Degrees,
               ((long)ac - (long)lines) / 0x98 & 0xffffffff,((long)ac - (long)lines) % 0x98);
      }
      bVar15 = line_t::isLinePortal((line_t *)ac);
      if (frontflag == 0 && bVar15) {
        EnterLinePortal(this,(line_t *)ac,in->frac);
        goto LAB_0041f6f5;
      }
      if (((ac->super_DThinker).super_DObject.ObjectFlags & 0x8004) != 4) goto LAB_0041f6f5;
      _planestocheck = in->frac * it.trace.dx + it.trace.x;
      dStack_190 = in->frac * it.trace.dy + it.trace.y;
      P_LineOpening(&open,(AActor *)0x0,(line_t *)ac,(DVector2 *)&planestocheck,(DVector2 *)0x0,
                    0x100);
      if ((open.range <= 0.0) || (open.top <= open.bottom)) goto LAB_0041f6f5;
      dVar19 = this->attackrange * in->frac;
      if ((open.bottom != -3.4028234663852886e+38) || (NAN(open.bottom))) {
        dVar20 = c_atan2(open.bottom - this->shootz,dVar19);
        if (dVar20 * -57.29577951308232 < (this->bottompitch).Degrees) {
          (this->bottompitch).Degrees = dVar20 * -57.29577951308232;
        }
      }
      if ((open.top != 3.4028234663852886e+38) || (NAN(open.top))) {
        dVar20 = c_atan2(open.top - this->shootz,dVar19);
        dVar20 = dVar20 * -57.29577951308232;
        dVar19 = (this->toppitch).Degrees;
        if (dVar19 < dVar20) {
          (this->toppitch).Degrees = dVar20;
          dVar19 = dVar20;
        }
      }
      else {
        dVar19 = (this->toppitch).Degrees;
      }
      if (((this->bottompitch).Degrees <= dVar19) ||
         (bVar15 = AimTraverse3DFloors(this,&it.trace,in,frontflag,&planestocheck), !bVar15))
      goto LAB_0041f6f5;
      if (aimdebug.Value == true) {
        Printf("After line %d: toppitch = %f, bottompitch = %f, planestocheck = %d\n",
               SUB84((this->toppitch).Degrees,0),(this->bottompitch).Degrees,
               ((long)ac - (long)lines) / 0x98 & 0xffffffff,(ulong)_planestocheck & 0xffffffff);
      }
      psVar4 = (sector_t_conflict *)(&ac->SpriteAngle)[frontflag == 0].Degrees;
      this->lastsector = psVar4;
      if ((((((ulong)_planestocheck & 1) != 0) && (dVar19 = (this->toppitch).Degrees, dVar19 < 0.0))
          && ((open.top != 3.4028234663852886e+38 || (NAN(open.top))))) &&
         ((psVar4->planes[1].Flags & 0x1d0U) == 0x100)) {
        dVar20 = (this->bottompitch).Degrees;
        local_148.Degrees = 0.0;
        if (dVar20 <= 0.0) {
          local_148.Degrees = dVar20;
        }
        local_140.Degrees = dVar19;
        EnterSectorPortal(this,1,in->frac,psVar4,&local_140,&local_148);
      }
      if ((((planestocheck & 2U) != 0) && (dVar19 = (this->bottompitch).Degrees, 0.0 < dVar19)) &&
         (((open.bottom != -3.4028234663852886e+38 || (NAN(open.bottom))) &&
          ((psVar4->planes[0].Flags & 0x1d0U) == 0x100)))) {
        dVar20 = (this->toppitch).Degrees;
        local_150.Degrees = 0.0;
        if (0.0 <= dVar20) {
          local_150.Degrees = dVar20;
        }
        local_158.Degrees = dVar19;
        EnterSectorPortal(this,0,in->frac,psVar4,&local_150,&local_158);
      }
    }
  } while ((ac == this->shootthing) || (this->aimtarget != (AActor *)0x0 && ac != this->aimtarget));
  uVar3 = this->flags;
  if ((uVar3 & 8) == 0) {
    if ((uVar3 & 4) == 0) {
LAB_0041f31e:
      if ((((ac->flags).Value & 4) == 0) ||
         ((((((ac->flags3).Value & 8) != 0 &&
            (ppVar8 = this->shootthing->player, ppVar8 != (player_t *)0x0)) &&
           (pAVar9 = ppVar8->ReadyWeapon, pAVar9 != (AWeapon *)0x0)) &&
          (((pAVar9->super_AStateProvider).super_AInventory.super_AActor.flags2.Value & 0x4000) != 0
          )))) goto LAB_0041ef83;
    }
  }
  else if (((uVar3 & 4) == 0) && (ac->Conversation == (FStrifeDialogueNode *)0x0))
  goto LAB_0041f31e;
  dVar19 = this->attackrange * in->frac;
  if ((cl_doautoaim.Value != false) || (((ac->flags6).Value & 0x20000000) == 0)) {
    if ((this->lastsector == (sector_t_conflict *)ac->Sector) &&
       ((((sector_t_conflict *)ac->Sector)->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.
        Count != 0)) {
      if (this->lastceilingplane != (secplane_t *)0x0) {
        dVar20 = secplane_t::ZatPoint(this->lastceilingplane,ac);
        dVar20 = c_atan2(dVar20 - this->shootz,dVar19);
        dVar20 = dVar20 * -57.29577951308232;
        if ((this->toppitch).Degrees <= dVar20 && dVar20 != (this->toppitch).Degrees) {
          (this->toppitch).Degrees = dVar20;
        }
      }
      if (*local_188 != (secplane_t *)0x0) {
        dVar20 = secplane_t::ZatPoint(*local_188,ac);
        dVar20 = c_atan2(dVar20 - this->shootz,dVar19);
        if (dVar20 * -57.29577951308232 < (this->bottompitch).Degrees) {
          (this->bottompitch).Degrees = dVar20 * -57.29577951308232;
        }
      }
    }
    dVar20 = c_atan2(((ac->__Pos).Z + ac->Height) - this->shootz,dVar19);
    dVar20 = dVar20 * -57.29577951308232;
    if (dVar20 < (this->bottompitch).Degrees || dVar20 == (this->bottompitch).Degrees) {
      dVar10 = c_atan2((ac->__Pos).Z - this->shootz,dVar19);
      dVar10 = dVar10 * -57.29577951308232;
      dVar19 = (this->toppitch).Degrees;
      if (dVar19 <= dVar10) {
        if ((this->crossedffloors == true) && (this->unlinked == false)) {
          bVar15 = P_CheckSight(this->shootthing,ac,9);
          dVar19 = (this->toppitch).Degrees;
          if (bVar15) goto LAB_0041f436;
          if (dVar19 <= dVar20) {
            dVar2 = (this->bottompitch).Degrees;
            if ((dVar2 < dVar10) && (dVar20 < dVar2)) {
              (this->bottompitch).Degrees = dVar20;
            }
          }
          else if (dVar19 < dVar10) {
            (this->toppitch).Degrees = dVar10;
            dVar19 = dVar10;
          }
          if ((this->bottompitch).Degrees <= dVar19) {
LAB_0041f6f5:
            FPathTraverse::~FPathTraverse(&it);
            return;
          }
        }
        else {
LAB_0041f436:
          if (dVar19 <= dVar20) {
            dVar19 = dVar20;
          }
          dVar20 = (this->bottompitch).Degrees;
          if (dVar10 <= dVar20) {
            dVar20 = dVar10;
          }
          dVar19 = dVar20 * 0.5 + dVar19 * 0.5;
          if ((this->flags & 2) != 0) {
            dVar20 = fastcosdeg(dVar19);
            if ((dVar20 != 0.0) || (NAN(dVar20))) {
              open.top = it.trace.dx;
              open.bottom = it.trace.dy;
              dVar10 = TVector2<double>::Length((TVector2<double> *)&open);
              dVar20 = (dVar10 * in->frac) / dVar20;
              if (this->attackrange <= dVar20 && dVar20 != this->attackrange) goto LAB_0041f6f5;
            }
          }
          if (((this->flags & 0x10) == 0) ||
             (bVar15 = AActor::IsFriend(ac,this->friender),
             !bVar15 || this->aimtarget != (AActor *)0x0)) {
            if ((sv_smartaim.Value == 0) ||
               (((this->flags & 1) != 0 || (this->aimtarget != (AActor *)0x0)))) {
              if (aimdebug.Value == true) {
                pPVar11 = DObject::GetClass((DObject *)ac);
                Printf("Hit target %s at %f,%f,%f\n",SUB84((ac->__Pos).X,0),(ac->__Pos).Y,
                       (ac->__Pos).Z,
                       FName::NameData.NameArray
                       [(pPVar11->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index
                       ].Text);
              }
              uVar17 = SUB84(in->frac,0);
              uVar18 = (undefined4)((ulong)in->frac >> 0x20);
              pDVar12 = &local_138;
LAB_0041f7ae:
              pDVar12->Degrees = dVar19;
              SetResult(this,res,(double)CONCAT44(uVar18,uVar17),ac,pDVar12);
              goto LAB_0041f6f5;
            }
            bVar15 = AActor::IsFriend(ac,this->friender);
            if (bVar15) {
              if (1 < sv_smartaim.Value) goto LAB_0041ef83;
              if (aimdebug.Value == true) {
                pPVar11 = DObject::GetClass((DObject *)ac);
                Printf("Hit friend %s at %f,%f,%f\n",SUB84((ac->__Pos).X,0),(ac->__Pos).Y,
                       (ac->__Pos).Z,
                       FName::NameData.NameArray
                       [(pPVar11->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index
                       ].Text);
              }
              uVar17 = SUB84(in->frac,0);
              uVar18 = (undefined4)((ulong)in->frac >> 0x20);
              pDVar12 = &local_160;
              res_00 = local_178;
              local_160.Degrees = dVar19;
            }
            else {
              if ((((ac->flags3).Value & 0x2000) != 0) || (ac->player != (player_t *)0x0)) {
                if (aimdebug.Value == true) {
                  pPVar11 = DObject::GetClass((DObject *)ac);
                  Printf("Hit target %s at %f,%f,%f\n",SUB84((ac->__Pos).X,0),(ac->__Pos).Y,
                         (ac->__Pos).Z,
                         FName::NameData.NameArray
                         [(pPVar11->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.
                          Index].Text);
                }
                uVar17 = SUB84(in->frac,0);
                uVar18 = (undefined4)((ulong)in->frac >> 0x20);
                pDVar12 = &local_130;
                goto LAB_0041f7ae;
              }
              if (2 < sv_smartaim.Value) goto LAB_0041ef83;
              if (aimdebug.Value == true) {
                pPVar11 = DObject::GetClass((DObject *)ac);
                Printf("Hit other %s at %f,%f,%f\n",SUB84((ac->__Pos).X,0),(ac->__Pos).Y,
                       (ac->__Pos).Z,
                       FName::NameData.NameArray
                       [(pPVar11->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index
                       ].Text);
              }
              uVar17 = SUB84(in->frac,0);
              uVar18 = (undefined4)((ulong)in->frac >> 0x20);
              pDVar12 = &local_168;
              res_00 = local_180;
              local_168.Degrees = dVar19;
            }
            SetResult(this,res_00,(double)CONCAT44(uVar18,uVar17),ac,pDVar12);
          }
        }
      }
    }
  }
  goto LAB_0041ef83;
}

Assistant:

void Clear()
	{
		memset(this, 0, sizeof(*this));
		frac = FLT_MAX;
	}